

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WatcherGeneric.cpp
# Opt level: O2

bool __thiscall efsw::WatcherGeneric::pathInWatches(WatcherGeneric *this,string *path)

{
  DirWatcherGeneric *this_00;
  bool bVar1;
  string local_30;
  
  this_00 = this->DirWatch;
  std::__cxx11::string::string((string *)&local_30,(string *)path);
  bVar1 = DirWatcherGeneric::pathInWatches(this_00,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

bool WatcherGeneric::pathInWatches( std::string path ) {
	return DirWatch->pathInWatches( path );
}